

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O1

QDomElementPrivate * __thiscall QDomDocumentPrivate::documentElement(QDomDocumentPrivate *this)

{
  int iVar1;
  QDomElementPrivate *pQVar2;
  
  pQVar2 = (QDomElementPrivate *)(this->super_QDomNodePrivate).first;
  while( true ) {
    if (pQVar2 == (QDomElementPrivate *)0x0) {
      return (QDomElementPrivate *)0x0;
    }
    iVar1 = (*(pQVar2->super_QDomNodePrivate)._vptr_QDomNodePrivate[0xb])(pQVar2);
    if (iVar1 == 1) break;
    pQVar2 = (QDomElementPrivate *)(pQVar2->super_QDomNodePrivate).next;
  }
  return pQVar2;
}

Assistant:

QDomElementPrivate* QDomDocumentPrivate::documentElement()
{
    QDomNodePrivate *p = first;
    while (p && !p->isElement())
        p = p->next;

    return static_cast<QDomElementPrivate *>(p);
}